

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLNodePrivate::RemoveAllChildren(ON_XMLNodePrivate *this)

{
  ON_XMLNode *pOVar1;
  int iVar2;
  undefined4 extraout_var;
  ON_XMLNode *pDelete;
  ON_XMLNode *pNode;
  lock_guard<std::recursive_mutex> local_18;
  lock_guard<std::recursive_mutex> lg;
  ON_XMLNodePrivate *this_local;
  
  lg._M_device = (mutex_type *)this;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_18,&this->m_mutex);
  if (this->m_first_child != (ON_XMLNode *)0x0) {
    pOVar1 = this->m_first_child;
    while (pDelete = pOVar1, pDelete != (ON_XMLNode *)0x0) {
      iVar2 = (*pDelete->_vptr_ON_XMLNode[7])();
      pOVar1 = (ON_XMLNode *)CONCAT44(extraout_var,iVar2);
      if (pDelete != (ON_XMLNode *)0x0) {
        (*pDelete->_vptr_ON_XMLNode[1])();
      }
    }
    this->m_first_child = (ON_XMLNode *)0x0;
    this->m_last_child = (ON_XMLNode *)0x0;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void ON_XMLNodePrivate::RemoveAllChildren(void)
{
  std::lock_guard<std::recursive_mutex> lg(m_mutex);

  if (nullptr == m_first_child)
    return;

  auto* pNode = m_first_child;
  while (nullptr != pNode)
  {
    auto* pDelete = pNode;
    pNode = pNode->NextSibling();
    delete pDelete;
  }

  m_first_child = nullptr;
  m_last_child = nullptr;
}